

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

int64_t memory_tree_ns::pick_nearest(memory_tree *b,single_learner *base,uint32_t cn,example *ec)

{
  uint64_t *puVar1;
  int iVar2;
  node *pnVar3;
  example *peVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  
  pnVar3 = (b->nodes)._begin;
  uVar8 = 0xffffffffffffffff;
  if ((pnVar3[cn].examples_index._end != pnVar3[cn].examples_index._begin) &&
     (pnVar3 = (b->nodes)._begin, puVar5 = pnVar3[cn].examples_index._begin,
     pnVar3[cn].examples_index._end != puVar5)) {
    uVar6 = 0;
    fVar9 = -3.4028235e+38;
    do {
      uVar7 = (ulong)puVar5[uVar6];
      if ((b->learn_at_leaf == 1) && (b->current_pass != 0)) {
        fVar10 = normalized_linear_prod(b,ec,(b->examples)._begin[uVar7]);
        diag_kronecker_product_test(ec,(b->examples)._begin[uVar7],b->kprod_ec,b->oas);
        peVar4 = b->kprod_ec;
        (peVar4->l).cs.costs._begin = (wclass *)0x7f7fffff;
        (peVar4->l).simple.initial = fVar10;
        peVar4 = b->kprod_ec;
        iVar2 = (int)b->max_routers;
        puVar1 = &(peVar4->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar2);
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar4)
        ;
        puVar1 = &(peVar4->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(iVar2 * *(int *)(base + 0xe0));
        fVar10 = b->kprod_ec->partial_prediction;
      }
      else {
        fVar10 = normalized_linear_prod(b,ec,(b->examples)._begin[uVar7]);
      }
      if (fVar10 <= fVar9) {
        fVar10 = fVar9;
        uVar7 = uVar8;
      }
      uVar8 = uVar7;
      uVar6 = uVar6 + 1;
      pnVar3 = (b->nodes)._begin;
      puVar5 = pnVar3[cn].examples_index._begin;
      fVar9 = fVar10;
    } while (uVar6 < (ulong)((long)pnVar3[cn].examples_index._end - (long)puVar5 >> 2));
  }
  return uVar8;
}

Assistant:

int64_t pick_nearest(memory_tree& b, single_learner& base, const uint32_t cn, example& ec)
    {
        if (b.nodes[cn].examples_index.size() > 0)
        {
            float max_score = -FLT_MAX;
            int64_t max_pos = -1;
            for(size_t i = 0; i < b.nodes[cn].examples_index.size(); i++)
            {
                float score = 0.f;
                uint32_t loc = b.nodes[cn].examples_index[i];

                //do not use reward to update memory tree during the very first pass 
                //(which is for unsupervised training for memory tree)
                if (b.learn_at_leaf == true && b.current_pass >= 1){ 
                    float tmp_s = normalized_linear_prod(b, &ec, b.examples[loc]);
                    diag_kronecker_product_test(ec, *b.examples[loc], *b.kprod_ec, b.oas );
                    b.kprod_ec->l.simple = {FLT_MAX, 0., tmp_s};
                    base.predict(*b.kprod_ec, b.max_routers);
                    score = b.kprod_ec->partial_prediction;
                }
                else
                    score = normalized_linear_prod(b, &ec, b.examples[loc]);
                
                if (score > max_score){
                    max_score = score;
                    max_pos = (int64_t)loc;
                }
            }
            return max_pos;
        }
        else
            return -1;
    }